

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * findProc(void)

{
  bool bVar1;
  object *local_28;
  object *x;
  object *obj;
  object *s;
  int cond;
  int ret;
  
  x = (object *)0x0;
  bVar1 = true;
  obj = topScope;
  stringCopy(idName,guard->name);
  while (bVar1) {
    local_28 = obj->next;
    s._4_4_ = stringCompare(local_28->name,idName);
    while (s._4_4_ != 0) {
      local_28 = local_28->next;
      s._4_4_ = stringCompare(local_28->name,idName);
    }
    if ((local_28 != guard) || (obj == universe)) {
      bVar1 = false;
    }
    x = local_28;
    obj = obj->dsc;
  }
  return x;
}

Assistant:

object *findProc(void) {
	variable int ret; variable bool cond;
	variable struct object *s; variable struct object *obj; variable struct object *x;
	s = NULL; obj = NULL; x = NULL; cond = true;
	s = topScope;
	stringCopy(idName,guard->name);
	while (cond == true) {
		x=s->next;
		ret = stringCompare(x->name,idName);	
		while (ret != 0) {
			x = x->next;
			ret = stringCompare(x->name,idName);
		}
		if ((x != guard) || (s == universe)) {
			cond = false;
		}
		obj = x;
		s = s->dsc;
	}
	return obj;
}